

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

Aig_Obj_t * Saig_ObjHasUnlabeledFanout(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  bool bVar1;
  int iVar2;
  int local_38;
  int local_30;
  int local_2c;
  int i;
  int iFanout;
  Aig_Obj_t *pFanout;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  local_2c = -1;
  if (p->pFanData == (int *)0x0) {
    __assert_fail("p->pFanData",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                  ,0x85,"Aig_Obj_t *Saig_ObjHasUnlabeledFanout(Aig_Man_t *, Aig_Obj_t *)");
  }
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if (local_30 < (int)((uint)(*(ulong *)&pObj->field_0x18 >> 6) & 0x3ffffff)) {
      if (local_30 == 0) {
        local_38 = Aig_ObjFanout0Int(p,pObj->Id);
      }
      else {
        local_38 = Aig_ObjFanoutNext(p,local_2c);
      }
      local_2c = local_38;
      _i = Aig_ManObj(p,local_38 >> 1);
      bVar1 = true;
    }
    if (!bVar1) break;
    iVar2 = Saig_ObjIsPo(p,_i);
    if ((iVar2 != 0) || (iVar2 = Aig_ObjIsTravIdCurrent(p,_i), iVar2 == 0)) {
      return _i;
    }
    local_30 = local_30 + 1;
  }
  return (Aig_Obj_t *)0x0;
}

Assistant:

Aig_Obj_t * Saig_ObjHasUnlabeledFanout( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t * pFanout;
    int iFanout = -1, i;
    Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, i )
        if ( Saig_ObjIsPo(p, pFanout) || !Aig_ObjIsTravIdCurrent(p, pFanout) )
            return pFanout;
    return NULL;
}